

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O1

bool __thiscall draco::CornerTable::ComputeOppositeCorners(CornerTable *this,int *num_vertices)

{
  long lVar1;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar2;
  undefined8 uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  pointer pIVar7;
  void *__s;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar8;
  int iVar9;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar21;
  vector<int,_std::allocator<int>_> num_corners_on_vertices;
  vector<int,_std::allocator<int>_> vertex_offset;
  uint local_d4;
  allocator_type local_cd;
  int local_cc;
  vector<int,_std::allocator<int>_> local_c8;
  ulong local_b0;
  uint local_a4;
  CornerTable *local_a0;
  long local_98;
  pointer local_90;
  ulong local_88;
  void *local_80;
  vector<int,_std::allocator<int>_> local_78;
  long local_60;
  int *local_58;
  pointer local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (num_vertices != (int *)0x0) {
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::resize(&(this->opposite_corners_).vector_,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (value_type *)&kInvalidCornerIndex);
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              (&local_c8,
               (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->corner_to_vertex_map_).vector_.
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
    pIVar7 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (long)(this->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7;
    if ((int)(uVar20 >> 2) != 0) {
      uVar12 = 0;
      do {
        IVar21.value_ = pIVar7[uVar12].value_;
        if ((uint)((ulong)((long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2) <= IVar21.value_) {
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::resize
                    (&local_c8,(ulong)(IVar21.value_ + 1),(value_type_conflict1 *)&local_78);
        }
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[IVar21.value_] =
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[IVar21.value_] + 1;
        uVar12 = uVar12 + 1;
        pIVar7 = (this->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar20 = (long)(this->corner_to_vertex_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7;
      } while (uVar12 < (uVar20 >> 2 & 0xffffffff));
    }
    local_b0 = (ulong)(int)(uVar20 >> 2);
    if (local_b0 >> 0x3c != 0) {
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    if ((uVar20 << 0x1e) >> 0x20 == 0) {
      __s = (void *)0x0;
    }
    else {
      __s = operator_new(local_b0 * 8);
      memset(__s,0xff,local_b0 * 8);
    }
    local_80 = __s;
    local_58 = num_vertices;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_78,
               (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,&local_cd);
    num_vertices = local_58;
    local_60 = (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      iVar9 = 0;
      lVar14 = 0;
      do {
        *(int *)(CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) + lVar14 * 4) = iVar9;
        iVar9 = iVar9 + local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar14];
        lVar14 = lVar14 + 1;
      } while (local_60 + (ulong)(local_60 == 0) != lVar14);
    }
    pIVar7 = (this->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_48 = (ulong)((long)(this->corner_to_vertex_map_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar7) >> 2;
    if ((uint)local_48 != 0) {
      local_98 = CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
      local_50 = (this->opposite_corners_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_cc = this->num_degenerated_faces_;
      local_38 = (long)__s + 8;
      uVar20 = 0;
      local_90 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        uVar17 = (uint)uVar20;
        uVar5 = uVar17 - 2;
        if (0x55555555 < (uVar17 + 1) * -0x55555555) {
          uVar5 = uVar17 + 1;
        }
        IVar10.value_ = 0xffffffff;
        IVar21.value_ = 0xffffffff;
        if (uVar5 != 0xffffffff) {
          IVar21.value_ = pIVar7[uVar5].value_;
        }
        uVar5 = ((uVar17 * -0x55555555 < 0x55555556) - 1 | 2) + uVar17;
        if (uVar5 != 0xffffffff) {
          IVar10.value_ = pIVar7[uVar5].value_;
        }
        IVar2.value_ = pIVar7[uVar20].value_;
        if ((uVar17 * -0x55555555 < 0x55555556) &&
           (((pIVar7[uVar20].value_ == IVar21.value_ || (pIVar7[uVar20].value_ == IVar10.value_)) ||
            (IVar21.value_ == IVar10.value_)))) {
          local_cc = local_cc + 1;
          this->num_degenerated_faces_ = local_cc;
          uVar17 = uVar17 + 2;
        }
        else {
          iVar9 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[IVar10.value_];
          if (iVar9 < 1) {
            local_d4 = 0xffffffff;
          }
          else {
            iVar13 = *(int *)(local_98 + (ulong)IVar10.value_ * 4);
            local_d4 = 0xffffffff;
            iVar18 = 0;
            iVar19 = iVar9;
            do {
              iVar19 = iVar19 + -1;
              lVar14 = (long)iVar13;
              uVar5 = *(uint *)((long)__s + lVar14 * 8);
              iVar16 = 0xb;
              if (uVar5 != 0xffffffff) {
                if (uVar5 == IVar21.value_) {
                  uVar5 = *(uint *)((long)__s + lVar14 * 8 + 4);
                  if ((ulong)uVar5 == 0xffffffff) {
                    IVar8.value_ = 0xffffffff;
                  }
                  else {
                    IVar8.value_ = pIVar7[uVar5].value_;
                  }
                  if (IVar2.value_ == IVar8.value_) {
                    iVar16 = 0xd;
                  }
                  else {
                    lVar1 = local_38 + lVar14 * 8;
                    lVar15 = 0;
                    lVar14 = lVar14 << 0x20;
                    do {
                      lVar11 = lVar14;
                      iVar6 = (int)lVar15;
                      if (iVar19 == iVar6) break;
                      uVar3 = *(undefined8 *)(lVar1 + lVar15 * 8);
                      *(undefined8 *)(lVar1 + -8 + lVar15 * 8) = uVar3;
                      lVar15 = lVar15 + 1;
                      lVar14 = lVar11 + 0x100000000;
                    } while ((int)uVar3 != -1);
                    iVar13 = iVar13 + iVar6;
                    *(undefined4 *)((long)local_80 + (lVar11 >> 0x1d)) = 0xffffffff;
                    __s = local_80;
                    local_d4 = uVar5;
                  }
                }
                else {
                  iVar16 = 0;
                }
              }
              if ((iVar16 != 0xd) && (iVar16 != 0)) break;
              iVar18 = iVar18 + 1;
              iVar13 = iVar13 + 1;
            } while (iVar18 != iVar9);
          }
          local_a4 = IVar10.value_;
          local_88 = uVar20;
          local_40 = uVar20;
          if (local_d4 == 0xffffffff) {
            if (0 < local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[IVar21.value_]) {
              iVar9 = *(int *)(local_98 + (ulong)IVar21.value_ * 4);
              lVar14 = 0;
              do {
                if (*(int *)((long)__s + lVar14 * 8 + (long)iVar9 * 8) == -1) {
                  *(uint *)((long)__s + lVar14 * 8 + (long)iVar9 * 8) = IVar10.value_;
                  *(uint *)((long)__s + lVar14 * 8 + (long)iVar9 * 8 + 4) = uVar17;
                  break;
                }
                lVar14 = lVar14 + 1;
              } while (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[IVar21.value_] != (int)lVar14);
            }
          }
          else {
            local_50[uVar20].value_ = local_d4;
            local_50[local_d4].value_ = uVar17;
          }
        }
        uVar20 = (ulong)(uVar17 + 1);
      } while (uVar17 + 1 < (uint)local_48);
    }
    *local_58 = (int)local_60;
    pvVar4 = (void *)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    local_a0 = this;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar4);
    }
    if (__s != (void *)0x0) {
      operator_delete(__s,local_b0 << 3);
    }
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return num_vertices != (int *)0x0;
}

Assistant:

bool CornerTable::ComputeOppositeCorners(int *num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  if (num_vertices == nullptr) {
    return false;
  }
  opposite_corners_.resize(num_corners(), kInvalidCornerIndex);

  // Out implementation for finding opposite corners is based on keeping track
  // of outgoing half-edges for each vertex of the mesh. Half-edges (defined by
  // their opposite corners) are processed one by one and whenever a new
  // half-edge (corner) is processed, we check whether the sink vertex of
  // this half-edge contains its sibling half-edge. If yes, we connect them and
  // remove the sibling half-edge from the sink vertex, otherwise we add the new
  // half-edge to its source vertex.

  // First compute the number of outgoing half-edges (corners) attached to each
  // vertex.
  std::vector<int> num_corners_on_vertices;
  num_corners_on_vertices.reserve(num_corners());
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex v1 = Vertex(c);
    if (v1.value() >= static_cast<int>(num_corners_on_vertices.size())) {
      num_corners_on_vertices.resize(v1.value() + 1, 0);
    }
    // For each corner there is always exactly one outgoing half-edge attached
    // to its vertex.
    num_corners_on_vertices[v1.value()]++;
  }

  // Create a storage for half-edges on each vertex. We store all half-edges in
  // one array, where each entry is identified by the half-edge's sink vertex id
  // and the associated half-edge corner id (corner opposite to the half-edge).
  // Each vertex will be assigned storage for up to
  // |num_corners_on_vertices[vert_id]| half-edges. Unused half-edges are marked
  // with |sink_vert| == kInvalidVertexIndex.
  struct VertexEdgePair {
    VertexEdgePair()
        : sink_vert(kInvalidVertexIndex), edge_corner(kInvalidCornerIndex) {}
    VertexIndex sink_vert;
    CornerIndex edge_corner;
  };
  std::vector<VertexEdgePair> vertex_edges(num_corners(), VertexEdgePair());

  // For each vertex compute the offset (location where the first half-edge
  // entry of a given vertex is going to be stored). This way each vertex is
  // guaranteed to have a non-overlapping storage with respect to the other
  // vertices.
  std::vector<int> vertex_offset(num_corners_on_vertices.size());
  int offset = 0;
  for (size_t i = 0; i < num_corners_on_vertices.size(); ++i) {
    vertex_offset[i] = offset;
    offset += num_corners_on_vertices[i];
  }

  // Now go over the all half-edges (using their opposite corners) and either
  // insert them to the |vertex_edge| array or connect them with existing
  // half-edges.
  for (CornerIndex c(0); c < num_corners(); ++c) {
    const VertexIndex tip_v = Vertex(c);
    const VertexIndex source_v = Vertex(Next(c));
    const VertexIndex sink_v = Vertex(Previous(c));

    const FaceIndex face_index = Face(c);
    if (c == FirstCorner(face_index)) {
      // Check whether the face is degenerated, if so ignore it.
      const VertexIndex v0 = Vertex(c);
      if (v0 == source_v || v0 == sink_v || source_v == sink_v) {
        ++num_degenerated_faces_;
        c += 2;  // Ignore the next two corners of the same face.
        continue;
      }
    }

    CornerIndex opposite_c(kInvalidCornerIndex);
    // The maximum number of half-edges attached to the sink vertex.
    const int num_corners_on_vert = num_corners_on_vertices[sink_v.value()];
    // Where to look for the first half-edge on the sink vertex.
    offset = vertex_offset[sink_v.value()];
    for (int i = 0; i < num_corners_on_vert; ++i, ++offset) {
      const VertexIndex other_v = vertex_edges[offset].sink_vert;
      if (other_v == kInvalidVertexIndex) {
        break;  // No matching half-edge found on the sink vertex.
      }
      if (other_v == source_v) {
        if (tip_v == Vertex(vertex_edges[offset].edge_corner)) {
          continue;  // Don't connect mirrored faces.
        }
        // A matching half-edge was found on the sink vertex. Mark the
        // half-edge's opposite corner.
        opposite_c = vertex_edges[offset].edge_corner;
        // Remove the half-edge from the sink vertex. We remap all subsequent
        // half-edges one slot down.
        // TODO(ostava): This can be optimized a little bit, by remapping only
        // the half-edge on the last valid slot into the deleted half-edge's
        // slot.
        for (int j = i + 1; j < num_corners_on_vert; ++j, ++offset) {
          vertex_edges[offset] = vertex_edges[offset + 1];
          if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
            break;  // Unused half-edge reached.
          }
        }
        // Mark the last entry as unused.
        vertex_edges[offset].sink_vert = kInvalidVertexIndex;
        break;
      }
    }
    if (opposite_c == kInvalidCornerIndex) {
      // No opposite corner found. Insert the new edge
      const int num_corners_on_source_vert =
          num_corners_on_vertices[source_v.value()];
      offset = vertex_offset[source_v.value()];
      for (int i = 0; i < num_corners_on_source_vert; ++i, ++offset) {
        // Find the first unused half-edge slot on the source vertex.
        if (vertex_edges[offset].sink_vert == kInvalidVertexIndex) {
          vertex_edges[offset].sink_vert = sink_v;
          vertex_edges[offset].edge_corner = c;
          break;
        }
      }
    } else {
      // Opposite corner found.
      opposite_corners_[c] = opposite_c;
      opposite_corners_[opposite_c] = c;
    }
  }
  *num_vertices = static_cast<int>(num_corners_on_vertices.size());
  return true;
}